

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O3

void __thiscall EefcFlash::eraseAll(EefcFlash *this,uint32_t offset)

{
  uint32_t uVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  if (offset == 0) {
    waitFSR(this,1);
    Samba::writeWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 4,
                     0x5a000005);
    if ((this->super_Flash)._planes == 2) {
      waitFSR(this,1);
      Samba::writeWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 0x204,
                       0x5a000005);
    }
    waitFSR(this,0x1e);
    return;
  }
  uVar7 = (this->super_Flash)._size;
  if (offset % (uVar7 * 8) != 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_00118778;
    __cxa_throw(puVar2,&FlashEraseError::typeinfo,std::exception::~exception);
  }
  uVar5 = (ulong)offset / (ulong)uVar7;
  uVar7 = (this->super_Flash)._pages;
  if ((uint)uVar5 < uVar7) {
    do {
      uVar1 = (this->super_Flash)._planes;
      waitFSR(this,1);
      iVar6 = 4;
      uVar4 = (uint)uVar5;
      uVar3 = uVar4;
      if ((uVar7 >> 1 <= uVar4) && (uVar1 != 1)) {
        uVar3 = (uint)(uVar5 % (ulong)((this->super_Flash)._pages >> 1));
        iVar6 = 0x204;
      }
      Samba::writeWord((this->super_Flash)._samba,iVar6 + *(int *)&(this->super_Flash).field_0xf4,
                       uVar3 << 8 | 0x5a000107);
      uVar5 = (ulong)(uVar4 + 8);
      uVar7 = (this->super_Flash)._pages;
    } while (uVar4 + 8 < uVar7);
  }
  return;
}

Assistant:

void
EefcFlash::eraseAll(uint32_t offset)
{
    // Do a full chip erase if the offset is 0
    if (offset == 0)
    {
        waitFSR();
        writeFCR0(EEFC_FCMD_EA, 0);
        if (_planes == 2)
        {
            waitFSR();
            writeFCR1(EEFC_FCMD_EA, 0);
        }

        // Erase all can take an exceptionally long time on some devices
        // so wait on FSR for up to 30 seconds
        waitFSR(30);
    }
    // Else we must do it by pages
    else
    {
        // Offset must be on an erase page boundary
        if (offset % (_size * PagesPerErase))
            throw FlashEraseError();

        // Erase each PagesPerErase set of pages
        for (uint32_t pageNum = offset / _size; pageNum < _pages; pageNum += PagesPerErase)
        {
            if (_planes == 1 || pageNum < _pages / 2)
            {
                waitFSR();
                writeFCR0(EEFC_FCMD_EPA, pageNum | 0x1);
            }
            else
            {
                waitFSR();
                writeFCR1(EEFC_FCMD_EPA, (pageNum % (_pages / 2)) | 0x1);
            }
        }
    }
}